

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

void __thiscall
LowererMD::CheckShuffleLanes_4
          (LowererMD *this,uint8 *lanes,uint8 *lanesSrc,uint *fromSrc1,uint *fromSrc2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint i;
  long lVar4;
  
  if (lanes == (uint8 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xcae,"(lanes)","lanes");
    if (!bVar2) goto LAB_005f1987;
    *puVar3 = 0;
  }
  if (lanesSrc == (uint8 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xcaf,"(lanesSrc)","lanesSrc");
    if (!bVar2) goto LAB_005f1987;
    *puVar3 = 0;
  }
  if (fromSrc2 == (uint *)0x0 || fromSrc1 == (uint *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xcb0,"(fromSrc1 && fromSrc2)","fromSrc1 && fromSrc2");
    if (!bVar2) {
LAB_005f1987:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  else {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  *fromSrc1 = 0;
  *fromSrc2 = 0;
  lVar4 = 0;
  do {
    if (lVar4 == 4) {
      return;
    }
    if (lanes[lVar4] < 4) {
      *fromSrc1 = *fromSrc1 + 1;
      lanesSrc[lVar4] = '\x01';
    }
    else if (lanes[lVar4] < 8) {
      *fromSrc2 = *fromSrc2 + 1;
      lanesSrc[lVar4] = '\x02';
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0xcc1,"((0))","UNREACHED");
      if (!bVar2) goto LAB_005f1987;
      *puVar3 = 0;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void LowererMD::CheckShuffleLanes_4(uint8 lanes[], uint8 lanesSrc[], uint *fromSrc1, uint *fromSrc2)
{
    Assert(lanes);
    Assert(lanesSrc);
    Assert(fromSrc1 && fromSrc2);
    *fromSrc1 = 0;
    *fromSrc2 = 0;
    for (uint i = 0; i < 4; i++)
    {
        if (lanes[i] >= 0 && lanes[i] < 4)
        {
            (*fromSrc1)++;
            lanesSrc[i] = 1;
        }
        else if (lanes[i] >= 4 && lanes[i] < 8)
        {
            (*fromSrc2)++;
            lanesSrc[i] = 2;
        }
        else
        {
            Assert(UNREACHED);
        }
    }
}